

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSense.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkSensitivityMiter(Abc_Ntk_t *pNtk,int iVar)

{
  Abc_Aig_t *pAVar1;
  int iVar2;
  int iVar3;
  void **ppvVar4;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *local_b0;
  Abc_Obj_t *local_88;
  int local_5c;
  int i;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pOutput;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pMiter;
  Abc_Ntk_t *pAStack_18;
  int iVar_local;
  Abc_Ntk_t *pNtk_local;
  
  pMiter._4_4_ = iVar;
  pAStack_18 = pNtk;
  iVar2 = Abc_NtkIsStrash(pNtk);
  iVar3 = pMiter._4_4_;
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSense.c"
                  ,0x49,"Abc_Ntk_t *Abc_NtkSensitivityMiter(Abc_Ntk_t *, int)");
  }
  iVar2 = Abc_NtkCiNum(pAStack_18);
  if (iVar3 < iVar2) {
    vNodes = (Vec_Ptr_t *)Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    ppvVar4 = (void **)Extra_UtilStrsav(pAStack_18->pName);
    vNodes->pArray = ppvVar4;
    pcVar5 = Extra_UtilStrsav(pAStack_18->pSpec);
    *(char **)(vNodes + 1) = pcVar5;
    Abc_NtkCleanCopy(pAStack_18);
    pAVar6 = Abc_AigConst1((Abc_Ntk_t *)vNodes);
    pAVar7 = Abc_AigConst1(pAStack_18);
    (pAVar7->field_6).pCopy = pAVar6;
    pAVar6 = Abc_AigConst1((Abc_Ntk_t *)vNodes);
    pAVar7 = Abc_AigConst1(pAStack_18);
    (pAVar7->field_5).pData = pAVar6;
    for (local_5c = 0; iVar3 = Abc_NtkCiNum(pAStack_18), local_5c < iVar3; local_5c = local_5c + 1)
    {
      pNext = Abc_NtkCi(pAStack_18,local_5c);
      pAVar6 = Abc_NtkCreatePi((Abc_Ntk_t *)vNodes);
      (pNext->field_6).pCopy = pAVar6;
      pNext->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)pNext->field_6;
    }
    Abc_NtkAddDummyPiNames((Abc_Ntk_t *)vNodes);
    pNext = Abc_NtkCi(pAStack_18,pMiter._4_4_);
    pAVar6 = Abc_AigConst1((Abc_Ntk_t *)vNodes);
    pAVar6 = Abc_ObjNot(pAVar6);
    (pNext->field_6).pCopy = pAVar6;
    pAVar6 = Abc_AigConst1((Abc_Ntk_t *)vNodes);
    (pNext->field_5).pData = pAVar6;
    pObj = (Abc_Obj_t *)Abc_NtkDfsReverseNodes(pAStack_18,&pNext,1);
    for (local_5c = 0; iVar3 = Vec_PtrSize((Vec_Ptr_t *)pObj), local_5c < iVar3;
        local_5c = local_5c + 1) {
      pNext = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,local_5c);
      local_88 = pNext;
      if (pNext != (Abc_Obj_t *)0x0) {
        local_88 = (pNext->field_6).pCopy;
      }
      pFanin = local_88;
      while (pNext != (Abc_Obj_t *)0x0) {
        pAVar6 = Abc_ObjFanin0(pNext);
        iVar3 = Abc_NodeIsTravIdCurrent(pAVar6);
        if (iVar3 == 0) {
          pAVar7 = Abc_NtkSensitivityMiter_rec((Abc_Ntk_t *)vNodes,pAVar6);
          (pAVar6->field_5).pData = pAVar7;
        }
        pAVar6 = Abc_ObjFanin1(pNext);
        iVar3 = Abc_NodeIsTravIdCurrent(pAVar6);
        if (iVar3 == 0) {
          pAVar7 = Abc_NtkSensitivityMiter_rec((Abc_Ntk_t *)vNodes,pAVar6);
          (pAVar6->field_5).pData = pAVar7;
        }
        pAVar1 = *(Abc_Aig_t **)(vNodes + 0x10);
        pAVar6 = Abc_ObjChild0Copy(pNext);
        pAVar7 = Abc_ObjChild1Copy(pNext);
        pAVar6 = Abc_AigAnd(pAVar1,pAVar6,pAVar7);
        (pNext->field_6).pCopy = pAVar6;
        pAVar1 = *(Abc_Aig_t **)(vNodes + 0x10);
        pAVar6 = Abc_ObjChild0Data(pNext);
        pAVar7 = Abc_ObjChild1Data(pNext);
        pAVar6 = Abc_AigAnd(pAVar1,pAVar6,pAVar7);
        (pNext->field_5).pData = pAVar6;
        pNext = pFanin;
        if (pFanin == (Abc_Obj_t *)0x0) {
          local_b0 = pFanin;
        }
        else {
          local_b0 = (pFanin->field_6).pCopy;
        }
        pFanin = local_b0;
      }
    }
    Vec_PtrFree((Vec_Ptr_t *)pObj);
    pAVar6 = Abc_AigConst1((Abc_Ntk_t *)vNodes);
    pObjNew = Abc_ObjNot(pAVar6);
    for (local_5c = 0; iVar3 = Abc_NtkCoNum(pAStack_18), local_5c < iVar3; local_5c = local_5c + 1)
    {
      pNext = Abc_NtkCo(pAStack_18,local_5c);
      iVar3 = Abc_NodeIsTravIdCurrent(pNext);
      if (iVar3 != 0) {
        iVar3 = Abc_NtkCoNum(pAStack_18);
        if (local_5c == iVar3 + -1) {
          pAVar1 = *(Abc_Aig_t **)(vNodes + 0x10);
          pAVar6 = Abc_ObjChild0Data(pNext);
          pAVar6 = Abc_AigAnd(pAVar1,pObjNew,pAVar6);
          pAVar1 = *(Abc_Aig_t **)(vNodes + 0x10);
          pAVar7 = Abc_ObjChild0Copy(pNext);
          pObjNew = Abc_AigAnd(pAVar1,pAVar6,pAVar7);
        }
        else {
          pAVar1 = *(Abc_Aig_t **)(vNodes + 0x10);
          pAVar6 = Abc_ObjChild0Copy(pNext);
          pAVar7 = Abc_ObjChild0Data(pNext);
          pAVar6 = Abc_AigXor(pAVar1,pAVar6,pAVar7);
          pObjNew = Abc_AigOr(*(Abc_Aig_t **)(vNodes + 0x10),pObjNew,pAVar6);
        }
      }
    }
    pAVar6 = Abc_NtkCreatePo((Abc_Ntk_t *)vNodes);
    Abc_ObjAddFanin(pAVar6,pObjNew);
    Abc_ObjAssignName(pAVar6,"miter",(char *)0x0);
    iVar3 = Abc_NtkCheck((Abc_Ntk_t *)vNodes);
    if (iVar3 == 0) {
      printf("Abc_NtkSensitivityMiter: The network check has failed.\n");
      Abc_NtkDelete((Abc_Ntk_t *)vNodes);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      pNtk_local = (Abc_Ntk_t *)vNodes;
    }
    return pNtk_local;
  }
  __assert_fail("iVar < Abc_NtkCiNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSense.c"
                ,0x4a,"Abc_Ntk_t *Abc_NtkSensitivityMiter(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkSensitivityMiter( Abc_Ntk_t * pNtk, int iVar )
{
    Abc_Ntk_t * pMiter;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pNext, * pFanin, * pOutput, * pObjNew;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( iVar < Abc_NtkCiNum(pNtk) );

    // duplicate the network
    pMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pMiter->pName = Extra_UtilStrsav(pNtk->pName);
    pMiter->pSpec = Extra_UtilStrsav(pNtk->pSpec);

    // assign the PIs
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pMiter);
    Abc_AigConst1(pNtk)->pData = Abc_AigConst1(pMiter);
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pObj->pCopy = Abc_NtkCreatePi( pMiter );
        pObj->pData = pObj->pCopy;
    }
    Abc_NtkAddDummyPiNames( pMiter );

    // assign the cofactors of the CI node to be constants
    pObj = Abc_NtkCi( pNtk, iVar );
    pObj->pCopy = Abc_ObjNot( Abc_AigConst1(pMiter) ); 
    pObj->pData = Abc_AigConst1(pMiter); 

    // collect the internal nodes
    vNodes = Abc_NtkDfsReverseNodes( pNtk, &pObj, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        for ( pNext = pObj? pObj->pCopy : pObj; pObj; pObj = pNext, pNext = pObj? pObj->pCopy : pObj )
        {
            pFanin = Abc_ObjFanin0(pObj);
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                pFanin->pData = Abc_NtkSensitivityMiter_rec( pMiter, pFanin );
            pFanin = Abc_ObjFanin1(pObj);
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                pFanin->pData = Abc_NtkSensitivityMiter_rec( pMiter, pFanin );
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pMiter->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pMiter->pManFunc, Abc_ObjChild0Data(pObj), Abc_ObjChild1Data(pObj) );
        }
    }
    Vec_PtrFree( vNodes );

    // update the affected COs
    pOutput = Abc_ObjNot( Abc_AigConst1(pMiter) ); 
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        // get the result of quantification
        if ( i == Abc_NtkCoNum(pNtk) - 1 )
        {
            pOutput = Abc_AigAnd( (Abc_Aig_t *)pMiter->pManFunc, pOutput, Abc_ObjChild0Data(pObj) );
            pOutput = Abc_AigAnd( (Abc_Aig_t *)pMiter->pManFunc, pOutput, Abc_ObjChild0Copy(pObj) );
        }
        else
        {
            pNext   = Abc_AigXor( (Abc_Aig_t *)pMiter->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild0Data(pObj) );
            pOutput = Abc_AigOr( (Abc_Aig_t *)pMiter->pManFunc, pOutput, pNext );
        }
    }
    // add the PO node and name
    pObjNew = Abc_NtkCreatePo(pMiter);
    Abc_ObjAddFanin( pObjNew, pOutput );
    Abc_ObjAssignName( pObjNew, "miter", NULL );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pMiter ) )
    {
        printf( "Abc_NtkSensitivityMiter: The network check has failed.\n" );
        Abc_NtkDelete( pMiter );
        return NULL;
    }
    return pMiter;
}